

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_diag.c
# Opt level: O1

char * CVDiagGetReturnFlagName(long flag)

{
  char *pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  pcVar1 = (char *)malloc(0x1e);
  switch(flag) {
  case 0:
    builtin_strncpy(pcVar1,"CVDIAG_SUCCESS",0xf);
    break;
  default:
    builtin_strncpy(pcVar1,"NONE",5);
    break;
  case -7:
    builtin_strncpy(pcVar1,"CVDIAG_RHSFUNC_RECVR",0x15);
    break;
  case -6:
    builtin_strncpy(pcVar1,"CVDIAG_RHSFUNC_UNRECVR",0x17);
    break;
  case -5:
    uVar3._0_1_ = 'A';
    uVar3._1_1_ = 'G';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'I';
    uVar5._0_1_ = 'N';
    uVar5._1_1_ = 'V';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'F';
    uVar7._0_1_ = 'A';
    uVar7._1_1_ = 'I';
    uVar7._2_1_ = 'L';
    uVar7._3_1_ = '\0';
    goto LAB_0011267b;
  case -4:
    uVar3._0_1_ = 'A';
    uVar3._1_1_ = 'G';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'M';
    uVar5._0_1_ = 'E';
    uVar5._1_1_ = 'M';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'F';
    uVar7._0_1_ = 'A';
    uVar7._1_1_ = 'I';
    uVar7._2_1_ = 'L';
    uVar7._3_1_ = '\0';
    goto LAB_0011267b;
  case -3:
    uVar2._0_1_ = 'A';
    uVar2._1_1_ = 'G';
    uVar2._2_1_ = '_';
    uVar2._3_1_ = 'I';
    uVar4._0_1_ = 'L';
    uVar4._1_1_ = 'L';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'I';
    uVar6._0_1_ = 'N';
    uVar6._1_1_ = 'P';
    uVar6._2_1_ = 'U';
    uVar6._3_1_ = 'T';
    goto LAB_0011266b;
  case -2:
    uVar2._0_1_ = 'A';
    uVar2._1_1_ = 'G';
    uVar2._2_1_ = '_';
    uVar2._3_1_ = 'L';
    uVar4._0_1_ = 'M';
    uVar4._1_1_ = 'E';
    uVar4._2_1_ = 'M';
    uVar4._3_1_ = '_';
    uVar6._0_1_ = 'N';
    uVar6._1_1_ = 'U';
    uVar6._2_1_ = 'L';
    uVar6._3_1_ = 'L';
LAB_0011266b:
    pcVar1[0] = 'C';
    pcVar1[1] = 'V';
    pcVar1[2] = 'D';
    pcVar1[3] = 'I';
    *(undefined4 *)(pcVar1 + 4) = uVar2;
    *(undefined4 *)(pcVar1 + 8) = uVar4;
    *(undefined4 *)(pcVar1 + 0xc) = uVar6;
    pcVar1[0x10] = '\0';
    break;
  case -1:
    uVar3._0_1_ = 'A';
    uVar3._1_1_ = 'G';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'M';
    uVar5._0_1_ = 'E';
    uVar5._1_1_ = 'M';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'N';
    uVar7._0_1_ = 'U';
    uVar7._1_1_ = 'L';
    uVar7._2_1_ = 'L';
    uVar7._3_1_ = '\0';
LAB_0011267b:
    pcVar1[0] = 'C';
    pcVar1[1] = 'V';
    pcVar1[2] = 'D';
    pcVar1[3] = 'I';
    *(undefined4 *)(pcVar1 + 4) = uVar3;
    *(undefined4 *)(pcVar1 + 8) = uVar5;
    *(undefined4 *)(pcVar1 + 0xc) = uVar7;
  }
  return pcVar1;
}

Assistant:

char* CVDiagGetReturnFlagName(long int flag)
{
  char* name;

  name = (char*)malloc(30 * sizeof(char));

  switch (flag)
  {
  case CVDIAG_SUCCESS: sprintf(name, "CVDIAG_SUCCESS"); break;
  case CVDIAG_MEM_NULL: sprintf(name, "CVDIAG_MEM_NULL"); break;
  case CVDIAG_LMEM_NULL: sprintf(name, "CVDIAG_LMEM_NULL"); break;
  case CVDIAG_ILL_INPUT: sprintf(name, "CVDIAG_ILL_INPUT"); break;
  case CVDIAG_MEM_FAIL: sprintf(name, "CVDIAG_MEM_FAIL"); break;
  case CVDIAG_INV_FAIL: sprintf(name, "CVDIAG_INV_FAIL"); break;
  case CVDIAG_RHSFUNC_UNRECVR: sprintf(name, "CVDIAG_RHSFUNC_UNRECVR"); break;
  case CVDIAG_RHSFUNC_RECVR: sprintf(name, "CVDIAG_RHSFUNC_RECVR"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}